

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  float fVar50;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  float fVar76;
  undefined1 auVar75 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  uint uVar84;
  uint uVar85;
  uint uVar86;
  undefined1 auVar83 [64];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  RayQueryContext *local_1470;
  undefined1 local_1468 [16];
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  undefined4 local_1408;
  undefined4 local_1404;
  undefined4 local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  int *local_13d8;
  undefined8 local_13d0;
  RTCRayQueryContext *local_13c8;
  Ray *local_13c0;
  undefined4 *local_13b8;
  undefined4 local_13b0;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar50 = ray->tfar;
    if (0.0 <= fVar50) {
      local_1470 = context;
      aVar3 = (ray->dir).field_0;
      auVar51 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar74._8_4_ = 0x7fffffff;
      auVar74._0_8_ = 0x7fffffff7fffffff;
      auVar74._12_4_ = 0x7fffffff;
      auVar74 = vandps_avx((undefined1  [16])aVar3,auVar74);
      auVar77._8_4_ = 0x219392ef;
      auVar77._0_8_ = 0x219392ef219392ef;
      auVar77._12_4_ = 0x219392ef;
      auVar74 = vcmpps_avx(auVar74,auVar77,1);
      auVar74 = vblendvps_avx((undefined1  [16])aVar3,auVar77,auVar74);
      local_1410 = local_11d0;
      auVar77 = vrcpps_avx(auVar74);
      fVar53 = auVar77._0_4_;
      auVar71._0_4_ = fVar53 * auVar74._0_4_;
      fVar54 = auVar77._4_4_;
      auVar71._4_4_ = fVar54 * auVar74._4_4_;
      fVar55 = auVar77._8_4_;
      auVar71._8_4_ = fVar55 * auVar74._8_4_;
      fVar76 = auVar77._12_4_;
      auVar71._12_4_ = fVar76 * auVar74._12_4_;
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar74 = vsubps_avx(auVar78,auVar71);
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar2;
      local_11f8._0_4_ = uVar2;
      local_11f8._8_4_ = uVar2;
      local_11f8._12_4_ = uVar2;
      local_11f8._16_4_ = uVar2;
      local_11f8._20_4_ = uVar2;
      local_11f8._24_4_ = uVar2;
      local_11f8._28_4_ = uVar2;
      auVar80 = ZEXT3264(local_11f8);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar2;
      local_1218._0_4_ = uVar2;
      local_1218._8_4_ = uVar2;
      local_1218._12_4_ = uVar2;
      local_1218._16_4_ = uVar2;
      local_1218._20_4_ = uVar2;
      local_1218._24_4_ = uVar2;
      local_1218._28_4_ = uVar2;
      auVar81 = ZEXT3264(local_1218);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar2;
      local_1238._0_4_ = uVar2;
      local_1238._8_4_ = uVar2;
      local_1238._12_4_ = uVar2;
      local_1238._16_4_ = uVar2;
      local_1238._20_4_ = uVar2;
      local_1238._24_4_ = uVar2;
      local_1238._28_4_ = uVar2;
      auVar82 = ZEXT3264(local_1238);
      auVar72._0_4_ = fVar53 + fVar53 * auVar74._0_4_;
      auVar72._4_4_ = fVar54 + fVar54 * auVar74._4_4_;
      auVar72._8_4_ = fVar55 + fVar55 * auVar74._8_4_;
      auVar72._12_4_ = fVar76 + fVar76 * auVar74._12_4_;
      auVar74 = vshufps_avx(auVar72,auVar72,0);
      local_1258._16_16_ = auVar74;
      local_1258._0_16_ = auVar74;
      auVar83 = ZEXT3264(local_1258);
      auVar74 = vmovshdup_avx(auVar72);
      auVar77 = vshufps_avx(auVar72,auVar72,0x55);
      local_1278._16_16_ = auVar77;
      local_1278._0_16_ = auVar77;
      auVar87 = ZEXT3264(local_1278);
      auVar77 = vshufpd_avx(auVar72,auVar72,1);
      auVar71 = vshufps_avx(auVar72,auVar72,0xaa);
      local_1298._16_16_ = auVar71;
      local_1298._0_16_ = auVar71;
      auVar73 = ZEXT3264(local_1298);
      local_1418 = (ulong)(auVar72._0_4_ < 0.0) << 5;
      uVar47 = (ulong)(auVar74._0_4_ < 0.0) << 5 | 0x40;
      uVar46 = (ulong)(auVar77._0_4_ < 0.0) << 5 | 0x80;
      uVar48 = local_1418 ^ 0x20;
      auVar74 = vshufps_avx(auVar51,auVar51,0);
      local_12b8._16_16_ = auVar74;
      local_12b8._0_16_ = auVar74;
      auVar75 = ZEXT3264(local_12b8);
      auVar74 = vshufps_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),0);
      local_12d8._16_16_ = auVar74;
      local_12d8._0_16_ = auVar74;
      auVar79 = ZEXT3264(local_12d8);
      local_13a8 = mm_lookupmask_ps._240_16_;
LAB_002e35ef:
      do {
        uVar49 = local_1410[-1];
        local_1410 = local_1410 + -1;
        while ((uVar49 & 8) == 0) {
          auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + local_1418),auVar80._0_32_);
          auVar15._4_4_ = auVar83._4_4_ * auVar14._4_4_;
          auVar15._0_4_ = auVar83._0_4_ * auVar14._0_4_;
          auVar15._8_4_ = auVar83._8_4_ * auVar14._8_4_;
          auVar15._12_4_ = auVar83._12_4_ * auVar14._12_4_;
          auVar15._16_4_ = auVar83._16_4_ * auVar14._16_4_;
          auVar15._20_4_ = auVar83._20_4_ * auVar14._20_4_;
          auVar15._24_4_ = auVar83._24_4_ * auVar14._24_4_;
          auVar15._28_4_ = auVar14._28_4_;
          auVar14 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar47),auVar81._0_32_);
          auVar16._4_4_ = auVar87._4_4_ * auVar14._4_4_;
          auVar16._0_4_ = auVar87._0_4_ * auVar14._0_4_;
          auVar16._8_4_ = auVar87._8_4_ * auVar14._8_4_;
          auVar16._12_4_ = auVar87._12_4_ * auVar14._12_4_;
          auVar16._16_4_ = auVar87._16_4_ * auVar14._16_4_;
          auVar16._20_4_ = auVar87._20_4_ * auVar14._20_4_;
          auVar16._24_4_ = auVar87._24_4_ * auVar14._24_4_;
          auVar16._28_4_ = auVar14._28_4_;
          auVar14 = vmaxps_avx(auVar15,auVar16);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar46),auVar82._0_32_);
          auVar17._4_4_ = auVar73._4_4_ * auVar15._4_4_;
          auVar17._0_4_ = auVar73._0_4_ * auVar15._0_4_;
          auVar17._8_4_ = auVar73._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar73._12_4_ * auVar15._12_4_;
          auVar17._16_4_ = auVar73._16_4_ * auVar15._16_4_;
          auVar17._20_4_ = auVar73._20_4_ * auVar15._20_4_;
          auVar17._24_4_ = auVar73._24_4_ * auVar15._24_4_;
          auVar17._28_4_ = auVar15._28_4_;
          auVar15 = vmaxps_avx(auVar17,auVar75._0_32_);
          auVar14 = vmaxps_avx(auVar14,auVar15);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar48),auVar80._0_32_);
          auVar18._4_4_ = auVar83._4_4_ * auVar15._4_4_;
          auVar18._0_4_ = auVar83._0_4_ * auVar15._0_4_;
          auVar18._8_4_ = auVar83._8_4_ * auVar15._8_4_;
          auVar18._12_4_ = auVar83._12_4_ * auVar15._12_4_;
          auVar18._16_4_ = auVar83._16_4_ * auVar15._16_4_;
          auVar18._20_4_ = auVar83._20_4_ * auVar15._20_4_;
          auVar18._24_4_ = auVar83._24_4_ * auVar15._24_4_;
          auVar18._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar47 ^ 0x20)),
                               auVar81._0_32_);
          auVar19._4_4_ = auVar87._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = auVar87._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = auVar87._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar87._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = auVar87._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = auVar87._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = auVar87._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar18,auVar19);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar46 ^ 0x20)),
                               auVar82._0_32_);
          auVar20._4_4_ = auVar73._4_4_ * auVar16._4_4_;
          auVar20._0_4_ = auVar73._0_4_ * auVar16._0_4_;
          auVar20._8_4_ = auVar73._8_4_ * auVar16._8_4_;
          auVar20._12_4_ = auVar73._12_4_ * auVar16._12_4_;
          auVar20._16_4_ = auVar73._16_4_ * auVar16._16_4_;
          auVar20._20_4_ = auVar73._20_4_ * auVar16._20_4_;
          auVar20._24_4_ = auVar73._24_4_ * auVar16._24_4_;
          auVar20._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar20,auVar79._0_32_);
          auVar15 = vminps_avx(auVar15,auVar16);
          auVar14 = vcmpps_avx(auVar14,auVar15,2);
          uVar43 = vmovmskps_avx(auVar14);
          if (uVar43 == 0) {
            if (local_1410 == &local_11d8) {
              return;
            }
            goto LAB_002e35ef;
          }
          uVar43 = uVar43 & 0xff;
          uVar41 = uVar49 & 0xfffffffffffffff0;
          lVar45 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar49 = *(ulong *)(uVar41 + lVar45 * 8);
          uVar43 = uVar43 - 1 & uVar43;
          if (uVar43 != 0) {
            *local_1410 = uVar49;
            local_1410 = local_1410 + 1;
            lVar45 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            uVar49 = *(ulong *)(uVar41 + lVar45 * 8);
            uVar43 = uVar43 - 1 & uVar43;
            uVar44 = (ulong)uVar43;
            if (uVar43 != 0) {
              do {
                *local_1410 = uVar49;
                local_1410 = local_1410 + 1;
                lVar45 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                  }
                }
                uVar49 = *(ulong *)(uVar41 + lVar45 * 8);
                uVar44 = uVar44 & uVar44 - 1;
              } while (uVar44 != 0);
            }
          }
        }
        local_1420 = (ulong)((uint)uVar49 & 0xf) - 8;
        if (local_1420 != 0) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          local_1428 = 0;
          do {
            lVar45 = local_1428 * 0xb0;
            pfVar1 = (float *)(uVar49 + 0x80 + lVar45);
            fVar21 = *pfVar1;
            fVar22 = pfVar1[1];
            fVar23 = pfVar1[2];
            fVar24 = pfVar1[3];
            pfVar1 = (float *)(uVar49 + 0x40 + lVar45);
            fVar25 = *pfVar1;
            fVar26 = pfVar1[1];
            fVar27 = pfVar1[2];
            fVar28 = pfVar1[3];
            auVar51._0_4_ = fVar21 * fVar25;
            auVar51._4_4_ = fVar22 * fVar26;
            auVar51._8_4_ = fVar23 * fVar27;
            auVar51._12_4_ = fVar24 * fVar28;
            pfVar1 = (float *)(uVar49 + 0x70 + lVar45);
            fVar29 = *pfVar1;
            fVar30 = pfVar1[1];
            fVar31 = pfVar1[2];
            fVar32 = pfVar1[3];
            pfVar1 = (float *)(uVar49 + 0x50 + lVar45);
            fVar33 = *pfVar1;
            fVar34 = pfVar1[1];
            fVar35 = pfVar1[2];
            fVar36 = pfVar1[3];
            auVar56._0_4_ = fVar29 * fVar33;
            auVar56._4_4_ = fVar30 * fVar34;
            auVar56._8_4_ = fVar31 * fVar35;
            auVar56._12_4_ = fVar32 * fVar36;
            local_1448 = vsubps_avx(auVar56,auVar51);
            auVar74 = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar45);
            fVar88 = auVar74._0_4_;
            auVar57._0_4_ = fVar88 * fVar33;
            fVar89 = auVar74._4_4_;
            auVar57._4_4_ = fVar89 * fVar34;
            fVar90 = auVar74._8_4_;
            auVar57._8_4_ = fVar90 * fVar35;
            fVar91 = auVar74._12_4_;
            auVar57._12_4_ = fVar91 * fVar36;
            pfVar1 = (float *)(uVar49 + 0x30 + lVar45);
            fVar37 = *pfVar1;
            fVar38 = pfVar1[1];
            fVar39 = pfVar1[2];
            fVar40 = pfVar1[3];
            auVar65._0_4_ = fVar21 * fVar37;
            auVar65._4_4_ = fVar22 * fVar38;
            auVar65._8_4_ = fVar23 * fVar39;
            auVar65._12_4_ = fVar24 * fVar40;
            local_1498 = vsubps_avx(auVar65,auVar57);
            auVar66._0_4_ = fVar29 * fVar37;
            auVar66._4_4_ = fVar30 * fVar38;
            auVar66._8_4_ = fVar31 * fVar39;
            auVar66._12_4_ = fVar32 * fVar40;
            auVar92._0_4_ = fVar88 * fVar25;
            auVar92._4_4_ = fVar89 * fVar26;
            auVar92._8_4_ = fVar90 * fVar27;
            auVar92._12_4_ = fVar91 * fVar28;
            local_1488 = vsubps_avx(auVar92,auVar66);
            uVar2 = *(undefined4 *)&(ray->org).field_0;
            auVar93._4_4_ = uVar2;
            auVar93._0_4_ = uVar2;
            auVar93._8_4_ = uVar2;
            auVar93._12_4_ = uVar2;
            local_1458 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + lVar45),auVar93);
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar94._4_4_ = uVar2;
            auVar94._0_4_ = uVar2;
            auVar94._8_4_ = uVar2;
            auVar94._12_4_ = uVar2;
            local_14a8 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x10 + lVar45),auVar94);
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar95._4_4_ = uVar2;
            auVar95._0_4_ = uVar2;
            auVar95._8_4_ = uVar2;
            auVar95._12_4_ = uVar2;
            local_1468 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + lVar45),auVar95);
            fVar50 = (ray->dir).field_0.m128[1];
            fVar53 = (ray->dir).field_0.m128[2];
            fVar55 = local_1468._0_4_;
            auVar96._0_4_ = fVar50 * fVar55;
            fVar5 = local_1468._4_4_;
            auVar96._4_4_ = fVar50 * fVar5;
            fVar8 = local_1468._8_4_;
            auVar96._8_4_ = fVar50 * fVar8;
            fVar11 = local_1468._12_4_;
            auVar96._12_4_ = fVar50 * fVar11;
            fVar76 = local_14a8._0_4_;
            auVar97._0_4_ = fVar53 * fVar76;
            fVar6 = local_14a8._4_4_;
            auVar97._4_4_ = fVar53 * fVar6;
            fVar9 = local_14a8._8_4_;
            auVar97._8_4_ = fVar53 * fVar9;
            fVar12 = local_14a8._12_4_;
            auVar97._12_4_ = fVar53 * fVar12;
            auVar51 = vsubps_avx(auVar97,auVar96);
            fVar54 = (ray->dir).field_0.m128[0];
            fVar4 = local_1458._0_4_;
            auVar52._0_4_ = fVar53 * fVar4;
            fVar7 = local_1458._4_4_;
            auVar52._4_4_ = fVar53 * fVar7;
            fVar10 = local_1458._8_4_;
            auVar52._8_4_ = fVar53 * fVar10;
            fVar13 = local_1458._12_4_;
            auVar52._12_4_ = fVar53 * fVar13;
            auVar58._0_4_ = fVar54 * fVar55;
            auVar58._4_4_ = fVar54 * fVar5;
            auVar58._8_4_ = fVar54 * fVar8;
            auVar58._12_4_ = fVar54 * fVar11;
            auVar77 = vsubps_avx(auVar58,auVar52);
            auVar59._0_4_ = fVar54 * fVar76;
            auVar59._4_4_ = fVar54 * fVar6;
            auVar59._8_4_ = fVar54 * fVar9;
            auVar59._12_4_ = fVar54 * fVar12;
            auVar67._0_4_ = fVar50 * fVar4;
            auVar67._4_4_ = fVar50 * fVar7;
            auVar67._8_4_ = fVar50 * fVar10;
            auVar67._12_4_ = fVar50 * fVar13;
            auVar71 = vsubps_avx(auVar67,auVar59);
            auVar78 = local_1488;
            auVar72 = local_1498;
            auVar68._0_4_ =
                 local_1448._0_4_ * fVar54 + fVar50 * local_1498._0_4_ + fVar53 * local_1488._0_4_;
            auVar68._4_4_ =
                 local_1448._4_4_ * fVar54 + fVar50 * local_1498._4_4_ + fVar53 * local_1488._4_4_;
            auVar68._8_4_ =
                 local_1448._8_4_ * fVar54 + fVar50 * local_1498._8_4_ + fVar53 * local_1488._8_4_;
            auVar68._12_4_ =
                 local_1448._12_4_ * fVar54 +
                 fVar50 * local_1498._12_4_ + fVar53 * local_1488._12_4_;
            auVar60._8_8_ = 0x8000000080000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar74 = vandps_avx(auVar68,auVar60);
            uVar43 = auVar74._0_4_;
            local_1398._0_4_ =
                 (float)(uVar43 ^ (uint)(fVar88 * auVar51._0_4_ +
                                        fVar21 * auVar71._0_4_ + fVar29 * auVar77._0_4_));
            uVar84 = auVar74._4_4_;
            local_1398._4_4_ =
                 (float)(uVar84 ^ (uint)(fVar89 * auVar51._4_4_ +
                                        fVar22 * auVar71._4_4_ + fVar30 * auVar77._4_4_));
            uVar85 = auVar74._8_4_;
            local_1398._8_4_ =
                 (float)(uVar85 ^ (uint)(fVar90 * auVar51._8_4_ +
                                        fVar23 * auVar71._8_4_ + fVar31 * auVar77._8_4_));
            uVar86 = auVar74._12_4_;
            local_1398._12_4_ =
                 (float)(uVar86 ^ (uint)(fVar91 * auVar51._12_4_ +
                                        fVar24 * auVar71._12_4_ + fVar32 * auVar77._12_4_));
            local_1388._0_4_ =
                 (float)(uVar43 ^ (uint)(fVar37 * auVar51._0_4_ +
                                        fVar33 * auVar71._0_4_ + fVar25 * auVar77._0_4_));
            local_1388._4_4_ =
                 (float)(uVar84 ^ (uint)(fVar38 * auVar51._4_4_ +
                                        fVar34 * auVar71._4_4_ + fVar26 * auVar77._4_4_));
            local_1388._8_4_ =
                 (float)(uVar85 ^ (uint)(fVar39 * auVar51._8_4_ +
                                        fVar35 * auVar71._8_4_ + fVar27 * auVar77._8_4_));
            local_1388._12_4_ =
                 (float)(uVar86 ^ (uint)(fVar40 * auVar51._12_4_ +
                                        fVar36 * auVar71._12_4_ + fVar28 * auVar77._12_4_));
            auVar77 = ZEXT416(0) << 0x20;
            auVar74 = vcmpps_avx(local_1398,auVar77,5);
            auVar51 = vcmpps_avx(local_1388,auVar77,5);
            auVar74 = vandps_avx(auVar74,auVar51);
            auVar61._8_4_ = 0x7fffffff;
            auVar61._0_8_ = 0x7fffffff7fffffff;
            auVar61._12_4_ = 0x7fffffff;
            local_1368 = vandps_avx(auVar68,auVar61);
            auVar51 = vcmpps_avx(auVar77,auVar68,4);
            auVar74 = vandps_avx(auVar74,auVar51);
            auVar62._0_4_ = local_1398._0_4_ + local_1388._0_4_;
            auVar62._4_4_ = local_1398._4_4_ + local_1388._4_4_;
            auVar62._8_4_ = local_1398._8_4_ + local_1388._8_4_;
            auVar62._12_4_ = local_1398._12_4_ + local_1388._12_4_;
            auVar51 = vcmpps_avx(auVar62,local_1368,2);
            auVar74 = vandps_avx(auVar74,auVar51);
            auVar51 = local_13a8 & auVar74;
            if ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar51[0xf] < '\0') {
              auVar74 = vandps_avx(auVar74,local_13a8);
              local_1378._0_4_ =
                   (float)(uVar43 ^ (uint)(local_1448._0_4_ * fVar4 +
                                          fVar76 * local_1498._0_4_ + fVar55 * local_1488._0_4_));
              local_1378._4_4_ =
                   (float)(uVar84 ^ (uint)(local_1448._4_4_ * fVar7 +
                                          fVar6 * local_1498._4_4_ + fVar5 * local_1488._4_4_));
              local_1378._8_4_ =
                   (float)(uVar85 ^ (uint)(local_1448._8_4_ * fVar10 +
                                          fVar9 * local_1498._8_4_ + fVar8 * local_1488._8_4_));
              local_1378._12_4_ =
                   (float)(uVar86 ^ (uint)(local_1448._12_4_ * fVar13 +
                                          fVar12 * local_1498._12_4_ + fVar11 * local_1488._12_4_));
              fVar50 = (ray->org).field_0.m128[3];
              fVar53 = local_1368._0_4_;
              auVar63._0_4_ = fVar53 * fVar50;
              fVar54 = local_1368._4_4_;
              auVar63._4_4_ = fVar54 * fVar50;
              fVar55 = local_1368._8_4_;
              auVar63._8_4_ = fVar55 * fVar50;
              fVar76 = local_1368._12_4_;
              auVar63._12_4_ = fVar76 * fVar50;
              auVar51 = vcmpps_avx(auVar63,local_1378,1);
              fVar50 = ray->tfar;
              auVar69._0_4_ = fVar53 * fVar50;
              auVar69._4_4_ = fVar54 * fVar50;
              auVar69._8_4_ = fVar55 * fVar50;
              auVar69._12_4_ = fVar76 * fVar50;
              auVar77 = vcmpps_avx(local_1378,auVar69,2);
              auVar51 = vandps_avx(auVar77,auVar51);
              local_1348 = vandps_avx(auVar51,auVar74);
              uVar43 = vmovmskps_avx(local_1348);
              if (uVar43 != 0) {
                local_1308 = local_1448;
                local_12f8 = local_1498._0_8_;
                uStack_12f0 = local_1498._8_8_;
                local_12e8 = local_1488._0_8_;
                uStack_12e0 = local_1488._8_8_;
                local_1448._0_8_ = local_1470->scene;
                auVar74 = vrcpps_avx(local_1368);
                fVar50 = auVar74._0_4_;
                auVar64._0_4_ = fVar53 * fVar50;
                fVar53 = auVar74._4_4_;
                auVar64._4_4_ = fVar54 * fVar53;
                fVar54 = auVar74._8_4_;
                auVar64._8_4_ = fVar55 * fVar54;
                fVar55 = auVar74._12_4_;
                auVar64._12_4_ = fVar76 * fVar55;
                auVar70._8_4_ = 0x3f800000;
                auVar70._0_8_ = 0x3f8000003f800000;
                auVar70._12_4_ = 0x3f800000;
                auVar74 = vsubps_avx(auVar70,auVar64);
                fVar50 = fVar50 + fVar50 * auVar74._0_4_;
                fVar53 = fVar53 + fVar53 * auVar74._4_4_;
                fVar54 = fVar54 + fVar54 * auVar74._8_4_;
                fVar55 = fVar55 + fVar55 * auVar74._12_4_;
                local_1318[0] = fVar50 * local_1378._0_4_;
                local_1318[1] = fVar53 * local_1378._4_4_;
                local_1318[2] = fVar54 * local_1378._8_4_;
                local_1318[3] = fVar55 * local_1378._12_4_;
                local_1338._0_4_ = fVar50 * local_1398._0_4_;
                local_1338._4_4_ = fVar53 * local_1398._4_4_;
                local_1338._8_4_ = fVar54 * local_1398._8_4_;
                local_1338._12_4_ = fVar55 * local_1398._12_4_;
                local_1328._0_4_ = fVar50 * local_1388._0_4_;
                local_1328._4_4_ = fVar53 * local_1388._4_4_;
                local_1328._8_4_ = fVar54 * local_1388._8_4_;
                local_1328._12_4_ = fVar55 * local_1388._12_4_;
                uVar41 = (ulong)(uVar43 & 0xff);
                local_1458._0_8_ = lVar45 + uVar49;
                lVar45 = lVar45 + uVar49;
                local_1498 = auVar72;
                local_1488 = auVar78;
                do {
                  local_1488._0_8_ = uVar41;
                  uVar44 = 0;
                  if (uVar41 != 0) {
                    for (; (uVar41 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  local_1498._0_8_ = uVar44;
                  local_13f0 = *(uint *)(lVar45 + 0x90 + uVar44 * 4);
                  uVar42 = CONCAT44(0,local_13f0);
                  local_14a8._0_8_ = uVar42;
                  local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + uVar42 * 8);
                  if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
                    uVar41 = uVar41 ^ 1L << (uVar44 & 0x3f);
                  }
                  else {
                    if ((local_1470->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_14a8._0_8_ = ray, *(long *)(local_1430 + 0x48) == 0))
                    goto LAB_002e3cbe;
                    local_1468._0_8_ = local_1470->args;
                    local_13c8 = local_1470->user;
                    local_1408 = *(undefined4 *)(local_1308 + uVar44 * 4);
                    local_1404 = *(undefined4 *)((long)&local_12f8 + uVar44 * 4);
                    local_1400 = *(undefined4 *)((long)&local_12e8 + uVar44 * 4);
                    local_13fc = *(undefined4 *)(local_1338 + uVar44 * 4);
                    local_13f8 = *(undefined4 *)(local_1328 + uVar44 * 4);
                    local_13f4 = *(undefined4 *)(local_1458._0_8_ + 0xa0 + uVar44 * 4);
                    local_13ec = local_13c8->instID[0];
                    local_13e8 = local_13c8->instPrimID[0];
                    fVar50 = ray->tfar;
                    ray->tfar = local_1318[uVar44];
                    local_14ac = -1;
                    local_13d8 = &local_14ac;
                    local_13d0 = *(undefined8 *)(local_1430 + 0x18);
                    local_14a8._0_8_ = ray;
                    local_13b8 = &local_1408;
                    local_13b0 = 1;
                    local_13c0 = ray;
                    if ((*(code **)(local_1430 + 0x48) == (code *)0x0) ||
                       ((**(code **)(local_1430 + 0x48))(&local_13d8), *local_13d8 != 0)) {
                      if ((*(code **)(local_1468._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_1468._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)))) {
LAB_002e3cbe:
                        ((Ray *)local_14a8._0_8_)->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_1468._0_8_ + 0x10))(&local_13d8);
                      if (*local_13d8 != 0) goto LAB_002e3cbe;
                    }
                    *(float *)(local_14a8._0_8_ + 0x20) = fVar50;
                    uVar41 = local_1488._0_8_ ^ 1L << (local_1498._0_8_ & 0x3f);
                    ray = (Ray *)local_14a8._0_8_;
                  }
                  lVar45 = local_1458._0_8_;
                } while (uVar41 != 0);
              }
            }
            local_1428 = local_1428 + 1;
          } while (local_1428 != local_1420);
        }
        auVar80 = ZEXT3264(local_11f8);
        auVar81 = ZEXT3264(local_1218);
        auVar82 = ZEXT3264(local_1238);
        auVar83 = ZEXT3264(local_1258);
        auVar87 = ZEXT3264(local_1278);
        auVar73 = ZEXT3264(local_1298);
        auVar75 = ZEXT3264(local_12b8);
        auVar79 = ZEXT3264(local_12d8);
      } while (local_1410 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }